

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_draw_list_path_curve_to
               (nk_draw_list *list,nk_vec2 p2,nk_vec2 p3,nk_vec2 p4,uint num_segments)

{
  undefined8 uVar1;
  nk_vec2 pos;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float local_58;
  float fStack_54;
  
  if ((list != (nk_draw_list *)0x0) && (list->path_count != 0)) {
    uVar2 = num_segments + (num_segments == 0);
    uVar1 = *(undefined8 *)
             ((long)(list->buffer->memory).ptr +
             (ulong)(list->path_count - 1) * 8 + (ulong)list->path_offset);
    uVar3 = 1;
    do {
      fVar4 = (float)uVar3 * (1.0 / (float)uVar2);
      fVar5 = 1.0 - fVar4;
      fVar7 = fVar5 * fVar5 * fVar5;
      fVar6 = fVar5 * fVar5 * 3.0 * fVar4;
      fVar5 = fVar5 * 3.0 * fVar4 * fVar4;
      fVar4 = fVar4 * fVar4 * fVar4;
      local_58 = (float)uVar1;
      fStack_54 = (float)((ulong)uVar1 >> 0x20);
      pos.y = fVar4 * p4.y + fVar5 * p3.y + fVar7 * fStack_54 + fVar6 * p2.y;
      pos.x = fVar4 * p4.x + fVar5 * p3.x + fVar7 * local_58 + fVar6 * p2.x;
      nk_draw_list_path_line_to(list,pos);
      uVar3 = uVar3 + 1;
    } while (uVar3 <= uVar2);
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_path_curve_to(struct nk_draw_list *list, struct nk_vec2 p2,
struct nk_vec2 p3, struct nk_vec2 p4, unsigned int num_segments)
{
float t_step;
unsigned int i_step;
struct nk_vec2 p1;

NK_ASSERT(list);
NK_ASSERT(list->path_count);
if (!list || !list->path_count) return;
num_segments = NK_MAX(num_segments, 1);

p1 = nk_draw_list_path_last(list);
t_step = 1.0f/(float)num_segments;
for (i_step = 1; i_step <= num_segments; ++i_step) {
float t = t_step * (float)i_step;
float u = 1.0f - t;
float w1 = u*u*u;
float w2 = 3*u*u*t;
float w3 = 3*u*t*t;
float w4 = t * t *t;
float x = w1 * p1.x + w2 * p2.x + w3 * p3.x + w4 * p4.x;
float y = w1 * p1.y + w2 * p2.y + w3 * p3.y + w4 * p4.y;
nk_draw_list_path_line_to(list, nk_vec2(x,y));
}
}